

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QRenderRule::drawFrame(QRenderRule *this,QPainter *p,QRect *rect)

{
  undefined1 auVar1 [16];
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_30._0_8_;
  local_30 = (QRect)(auVar1 << 0x40);
  drawBackground(this,p,rect,(QPoint *)&local_30);
  if ((this->bd).d.ptr != (QStyleSheetBorderData *)0x0) {
    local_30 = borderRect(this,rect);
    drawBorder(this,p,&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::drawFrame(QPainter *p, const QRect& rect)
{
    drawBackground(p, rect);
    if (hasBorder())
        drawBorder(p, borderRect(rect));
}